

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::VECTOR_FLATTEN_DIM_3_Test::TestBody(VECTOR_FLATTEN_DIM_3_Test *this)

{
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_05;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_06;
  bool bVar1;
  char *pcVar2;
  vector<int,_std::allocator<int>_> *local_308;
  vector<int,_std::allocator<int>_> *local_2f0;
  vector<int,_std::allocator<int>_> *local_2d8;
  AssertHelper local_270;
  Message local_268;
  allocator<int> local_259;
  int local_258 [12];
  iterator local_228;
  size_type local_220;
  vector<int,_std::allocator<int>_> local_218;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  Message local_1e8;
  int local_1dc;
  size_type local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_1a8 [8];
  vector<int,_std::allocator<int>_> res;
  allocator<std::vector<int,_std::allocator<int>_>_> local_187;
  undefined1 local_186;
  allocator<int> local_185;
  int local_184;
  iterator local_180;
  size_type local_178;
  allocator<int> local_16d;
  int local_16c [3];
  iterator local_160;
  size_type local_158;
  vector<int,_std::allocator<int>_> *local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_130;
  undefined1 local_118 [22];
  undefined1 local_102;
  allocator<int> local_101;
  int local_100 [2];
  iterator local_f8;
  size_type local_f0;
  allocator<int> local_d5;
  int local_d4 [3];
  iterator local_c8;
  size_type local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<int,_std::allocator<int>_> local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_50;
  undefined1 local_38 [24];
  type v;
  VECTOR_FLATTEN_DIM_3_Test *this_local;
  
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_68;
  local_102 = 1;
  local_d4[0] = 1;
  local_d4[1] = 2;
  local_d4[2] = 3;
  local_c8 = local_d4;
  local_c0 = 3;
  local_b8 = &local_b0;
  v.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_d5);
  __l_04._M_len = local_c0;
  __l_04._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_04,&local_d5);
  local_100[0] = 4;
  local_100[1] = 5;
  local_f8 = local_100;
  local_f0 = 2;
  local_b8 = &local_98;
  std::allocator<int>::allocator(&local_101);
  __l_03._M_len = local_f0;
  __l_03._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_03,&local_101);
  local_102 = 0;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_b0;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_118 + 0x15));
  __l_05._M_len =
       (size_type)
       local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_05._M_array =
       (iterator)
       local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_68,__l_05,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)(local_118 + 0x15));
  local_186 = 1;
  local_16c[0] = 6;
  local_16c[1] = 7;
  local_16c[2] = 8;
  local_160 = local_16c;
  local_158 = 3;
  local_150 = &local_148;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_50;
  std::allocator<int>::allocator(&local_16d);
  __l_01._M_len = local_158;
  __l_01._M_array = local_160;
  std::vector<int,_std::allocator<int>_>::vector(&local_148,__l_01,&local_16d);
  local_184 = 9;
  local_180 = &local_184;
  local_178 = 1;
  local_150 = &local_130;
  std::allocator<int>::allocator(&local_185);
  __l_00._M_len = local_178;
  __l_00._M_array = local_180;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_00,&local_185);
  local_186 = 0;
  local_118._0_8_ = &local_148;
  local_118._8_8_ = (pointer)0x2;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_187);
  __l_02._M_len = local_118._8_8_;
  __l_02._M_array = (iterator)local_118._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_50,__l_02,&local_187);
  local_38._0_8_ = &local_68;
  local_38._8_8_ = (pointer)0x2;
  this_00 = (allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             *)((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::allocator(this_00);
  __l_06._M_len = local_38._8_8_;
  __l_06._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)(local_38 + 0x10),__l_06,this_00);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)((long)&res.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7));
  local_2d8 = (vector<int,_std::allocator<int>_> *)local_38;
  do {
    local_2d8 = local_2d8 + -1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_2d8);
  } while (local_2d8 != &local_68);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_187);
  local_2f0 = (vector<int,_std::allocator<int>_> *)local_118;
  do {
    local_2f0 = local_2f0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_2f0);
  } while (local_2f0 != &local_148);
  std::allocator<int>::~allocator(&local_185);
  std::allocator<int>::~allocator(&local_16d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_118 + 0x15));
  local_308 = &local_80;
  do {
    local_308 = local_308 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_308);
  } while (local_308 != &local_b0);
  std::allocator<int>::~allocator(&local_101);
  std::allocator<int>::~allocator(&local_d5);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)&gtest_ar.message_,
           (vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)(local_38 + 0x10));
  dnet::data_types::vec_flater<int,_3U>::flatten
            ((output_type *)local_1a8,(input_type *)&gtest_ar.message_);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)&gtest_ar.message_);
  local_1d8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_1a8);
  local_1dc = 9;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1d0,"res.size()","9",&local_1d8,&local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_258[4] = 5;
  local_258[5] = 6;
  local_258[6] = 7;
  local_258[7] = 8;
  local_258[0] = 1;
  local_258[1] = 2;
  local_258[2] = 3;
  local_258[3] = 4;
  local_258[8] = 9;
  local_228 = local_258;
  local_220 = 9;
  std::allocator<int>::allocator(&local_259);
  __l._M_len = local_220;
  __l._M_array = local_228;
  std::vector<int,_std::allocator<int>_>::vector(&local_218,__l,&local_259);
  testing::internal::EqHelper<false>::
  Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((EqHelper<false> *)local_200,"res","vector<int>({1,2,3,4,5,6,7,8,9})",
             (vector<int,_std::allocator<int>_> *)local_1a8,&local_218);
  std::vector<int,_std::allocator<int>_>::~vector(&local_218);
  std::allocator<int>::~allocator(&local_259);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1a8);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(VECTOR_FLATTEN, DIM_3) {
        vector_dim<int, 3>::type v = {
                {
                        {1,2,3},
                        {4,5}
                },
                {
                        {6,7,8},
                        {9}
                }
        };
        vector<int> res = vec_flater<int, 3>::flatten(v);
        EXPECT_EQ(res.size(), 9);
        EXPECT_EQ(res, vector<int>({1,2,3,4,5,6,7,8,9}));
    }